

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O1

int TTransform(uint8_t *in,uint16_t *w)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined7 uVar18;
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  long lVar23;
  undefined1 auVar24 [16];
  ushort uVar25;
  byte bVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  uint uVar30;
  uint uVar32;
  uint uVar33;
  undefined1 auVar31 [16];
  uint uVar34;
  short sVar35;
  ushort uVar41;
  undefined1 auVar36 [16];
  short sVar42;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar43 [16];
  uint uVar44;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  undefined1 auVar45 [16];
  int tmp [16];
  ushort uVar26;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  
  lVar23 = 0;
  do {
    uVar5 = *(undefined4 *)(in + lVar23 * 2);
    bVar29 = (byte)((uint)uVar5 >> 0x18);
    uVar18 = CONCAT25((short)(((uint7)bVar29 << 0x30) >> 0x28),
                      CONCAT14((char)((uint)uVar5 >> 0x10),uVar5));
    uVar26 = (ushort)uVar5;
    uVar1 = (ulong)CONCAT43((int)(CONCAT34((int3)((uint7)uVar18 >> 0x20),uVar5) >> 0x18),
                            CONCAT12((char)((uint)uVar5 >> 8),uVar26)) & 0xffffffff00ffffff;
    uVar25 = uVar26 & 0xff;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = CONCAT62((int6)(uVar1 >> 0x10),uVar26) & 0xffffffffffff00ff;
    sVar35 = (short)((uint7)uVar18 >> 0x20);
    auVar36._0_2_ = sVar35 + uVar25;
    sVar42 = (short)(uVar1 >> 0x10);
    uVar26 = (ushort)bVar29;
    uVar41 = sVar42 + uVar26;
    auVar37._0_10_ = (unkuint10)uVar41 << 0x30;
    auVar38._0_12_ = ZEXT212(uVar41) << 0x30;
    auVar31._0_2_ = sVar35 - uVar25;
    auVar31._2_2_ = uVar26 - sVar42;
    auVar31._4_2_ = uVar25 - sVar35;
    auVar31._6_2_ = sVar42 - uVar26;
    auVar31._8_8_ = 0;
    auVar38._12_2_ = uVar41;
    auVar38._14_2_ = auVar31._6_2_;
    auVar37._12_4_ = auVar38._12_4_;
    auVar37._10_2_ = auVar31._4_2_;
    auVar36._8_8_ = (undefined8)(CONCAT64(auVar37._10_6_,CONCAT22(uVar25 + sVar35,uVar41)) >> 0x10);
    auVar36._6_2_ = auVar31._2_2_;
    auVar36._4_2_ = uVar26 + sVar42;
    auVar36._2_2_ = auVar31._0_2_;
    auVar27 = pshuflw(auVar27,auVar36,0xe8);
    auVar27 = pshufhw(auVar27,auVar27,0xe7);
    auVar28._0_4_ = auVar27._0_4_;
    auVar28._8_4_ = auVar27._8_4_;
    auVar28._12_4_ = auVar27._12_4_;
    auVar28._4_4_ = auVar28._8_4_;
    auVar31 = pshuflw(auVar31,auVar28,0x39);
    auVar27 = pshuflw(auVar28,auVar28,0x6c);
    auVar39._0_2_ = auVar31._0_2_ + auVar27._0_2_;
    sVar42 = auVar31._6_2_ + auVar27._6_2_;
    auVar39._8_8_ =
         (undefined8)
         (CONCAT64(CONCAT42(CONCAT22(auVar31._6_2_ - auVar27._6_2_,sVar42),
                            auVar31._4_2_ - auVar27._4_2_),
                   CONCAT22(auVar31._4_2_ + auVar27._4_2_,sVar42)) >> 0x10);
    auVar39._6_2_ = auVar31._2_2_ - auVar27._2_2_;
    auVar39._4_2_ = auVar31._2_2_ + auVar27._2_2_;
    auVar39._2_2_ = auVar31._0_2_ - auVar27._0_2_;
    auVar27 = pshuflw(auVar27,auVar39,0xa0);
    *(int *)((long)tmp + lVar23) = auVar27._0_4_ >> 0x10;
    *(int *)((long)tmp + lVar23 + 4) = auVar27._4_4_ >> 0x10;
    *(int *)((long)tmp + lVar23 + 8) = auVar27._8_4_ >> 0x10;
    *(int *)((long)tmp + lVar23 + 0xc) = auVar27._12_4_ >> 0x10;
    lVar23 = lVar23 + 0x10;
  } while (lVar23 != 0x40);
  uVar44 = tmp[0xc] + tmp[4] + tmp[8] + tmp[0];
  uVar46 = tmp[0xd] + tmp[5] + tmp[9] + tmp[1];
  uVar47 = tmp[0xe] + tmp[6] + tmp[10] + tmp[2];
  uVar48 = tmp[0xf] + tmp[7] + tmp[0xb] + tmp[3];
  uVar30 = (int)uVar44 >> 0x1f;
  uVar32 = (int)uVar46 >> 0x1f;
  uVar33 = (int)uVar47 >> 0x1f;
  uVar34 = (int)uVar48 >> 0x1f;
  auVar45._0_4_ = (uVar44 ^ uVar30) - uVar30;
  auVar45._4_4_ = (uVar46 ^ uVar32) - uVar32;
  auVar45._8_4_ = (uVar47 ^ uVar33) - uVar33;
  auVar45._12_4_ = (uVar48 ^ uVar34) - uVar34;
  uVar1 = *(ulong *)w;
  auVar6._8_4_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6._12_2_ = (short)(uVar1 >> 0x30);
  auVar10._8_2_ = (short)(uVar1 >> 0x20);
  auVar10._0_8_ = uVar1;
  auVar10._10_4_ = auVar6._10_4_;
  auVar19._6_8_ = 0;
  auVar19._0_6_ = auVar10._8_6_;
  auVar14._4_2_ = (short)(uVar1 >> 0x10);
  auVar14._0_4_ = (uint)uVar1;
  auVar14._6_8_ = SUB148(auVar19 << 0x40,6);
  uVar30 = (tmp[4] - tmp[0xc]) + (tmp[0] - tmp[8]);
  uVar32 = (tmp[5] - tmp[0xd]) + (tmp[1] - tmp[9]);
  uVar33 = (tmp[6] - tmp[0xe]) + (tmp[2] - tmp[10]);
  uVar34 = (tmp[7] - tmp[0xf]) + (tmp[3] - tmp[0xb]);
  uVar44 = (int)uVar30 >> 0x1f;
  uVar46 = (int)uVar32 >> 0x1f;
  uVar47 = (int)uVar33 >> 0x1f;
  uVar48 = (int)uVar34 >> 0x1f;
  auVar43._0_4_ = (uVar30 ^ uVar44) - uVar44;
  auVar43._4_4_ = (uVar32 ^ uVar46) - uVar46;
  auVar43._8_4_ = (uVar33 ^ uVar47) - uVar47;
  auVar43._12_4_ = (uVar34 ^ uVar48) - uVar48;
  uVar2 = *(ulong *)(w + 4);
  auVar7._8_4_ = 0;
  auVar7._0_8_ = uVar2;
  auVar7._12_2_ = (short)(uVar2 >> 0x30);
  auVar11._8_2_ = (short)(uVar2 >> 0x20);
  auVar11._0_8_ = uVar2;
  auVar11._10_4_ = auVar7._10_4_;
  auVar20._6_8_ = 0;
  auVar20._0_6_ = auVar11._8_6_;
  auVar15._4_2_ = (short)(uVar2 >> 0x10);
  auVar15._0_4_ = (uint)uVar2;
  auVar15._6_8_ = SUB148(auVar20 << 0x40,6);
  uVar30 = (tmp[0] - tmp[8]) - (tmp[4] - tmp[0xc]);
  uVar32 = (tmp[1] - tmp[9]) - (tmp[5] - tmp[0xd]);
  uVar33 = (tmp[2] - tmp[10]) - (tmp[6] - tmp[0xe]);
  uVar34 = (tmp[3] - tmp[0xb]) - (tmp[7] - tmp[0xf]);
  uVar44 = (int)uVar30 >> 0x1f;
  uVar46 = (int)uVar32 >> 0x1f;
  uVar47 = (int)uVar33 >> 0x1f;
  uVar48 = (int)uVar34 >> 0x1f;
  auVar40._0_4_ = (uVar30 ^ uVar44) - uVar44;
  auVar40._4_4_ = (uVar32 ^ uVar46) - uVar46;
  auVar40._8_4_ = (uVar33 ^ uVar47) - uVar47;
  auVar40._12_4_ = (uVar34 ^ uVar48) - uVar48;
  uVar3 = *(ulong *)(w + 8);
  auVar8._8_4_ = 0;
  auVar8._0_8_ = uVar3;
  auVar8._12_2_ = (short)(uVar3 >> 0x30);
  auVar12._8_2_ = (short)(uVar3 >> 0x20);
  auVar12._0_8_ = uVar3;
  auVar12._10_4_ = auVar8._10_4_;
  auVar21._6_8_ = 0;
  auVar21._0_6_ = auVar12._8_6_;
  auVar16._4_2_ = (short)(uVar3 >> 0x10);
  auVar16._0_4_ = (uint)uVar3;
  auVar16._6_8_ = SUB148(auVar21 << 0x40,6);
  uVar30 = (tmp[8] + tmp[0]) - (tmp[0xc] + tmp[4]);
  uVar32 = (tmp[9] + tmp[1]) - (tmp[0xd] + tmp[5]);
  uVar33 = (tmp[10] + tmp[2]) - (tmp[0xe] + tmp[6]);
  uVar34 = (tmp[0xb] + tmp[3]) - (tmp[0xf] + tmp[7]);
  uVar44 = (int)uVar30 >> 0x1f;
  uVar46 = (int)uVar32 >> 0x1f;
  uVar47 = (int)uVar33 >> 0x1f;
  uVar48 = (int)uVar34 >> 0x1f;
  auVar24._0_4_ = (uVar30 ^ uVar44) - uVar44;
  auVar24._4_4_ = (uVar32 ^ uVar46) - uVar46;
  auVar24._8_4_ = (uVar33 ^ uVar47) - uVar47;
  auVar24._12_4_ = (uVar34 ^ uVar48) - uVar48;
  uVar4 = *(ulong *)(w + 0xc);
  auVar9._8_4_ = 0;
  auVar9._0_8_ = uVar4;
  auVar9._12_2_ = (short)(uVar4 >> 0x30);
  auVar13._8_2_ = (short)(uVar4 >> 0x20);
  auVar13._0_8_ = uVar4;
  auVar13._10_4_ = auVar9._10_4_;
  auVar22._6_8_ = 0;
  auVar22._0_6_ = auVar13._8_6_;
  auVar17._4_2_ = (short)(uVar4 >> 0x10);
  auVar17._0_4_ = (uint)uVar4;
  auVar17._6_8_ = SUB148(auVar22 << 0x40,6);
  return (auVar9._10_4_ >> 0x10) * auVar24._12_4_ + (auVar8._10_4_ >> 0x10) * auVar40._12_4_ +
         (auVar7._10_4_ >> 0x10) * auVar43._12_4_ + (auVar6._10_4_ >> 0x10) * auVar45._12_4_ +
         auVar17._4_4_ * auVar24._4_4_ + auVar16._4_4_ * auVar40._4_4_ +
         auVar15._4_4_ * auVar43._4_4_ + auVar14._4_4_ * auVar45._4_4_ +
         (int)((auVar24._8_8_ & 0xffffffff) * ((ulong)auVar13._8_6_ & 0xffffffff)) +
         (int)((auVar40._8_8_ & 0xffffffff) * ((ulong)auVar12._8_6_ & 0xffffffff)) +
         (int)((auVar43._8_8_ & 0xffffffff) * ((ulong)auVar11._8_6_ & 0xffffffff)) +
         (int)((auVar45._8_8_ & 0xffffffff) * ((ulong)auVar10._8_6_ & 0xffffffff)) +
         auVar24._0_4_ * ((uint)uVar4 & 0xffff) + auVar40._0_4_ * ((uint)uVar3 & 0xffff) +
         auVar43._0_4_ * ((uint)uVar2 & 0xffff) + auVar45._0_4_ * ((uint)uVar1 & 0xffff);
}

Assistant:

static int TTransform(const uint8_t* WEBP_RESTRICT in,
                      const uint16_t* WEBP_RESTRICT w) {
  int sum = 0;
  int tmp[16];
  int i;
  // horizontal pass
  for (i = 0; i < 4; ++i, in += BPS) {
    const int a0 = in[0] + in[2];
    const int a1 = in[1] + in[3];
    const int a2 = in[1] - in[3];
    const int a3 = in[0] - in[2];
    tmp[0 + i * 4] = a0 + a1;
    tmp[1 + i * 4] = a3 + a2;
    tmp[2 + i * 4] = a3 - a2;
    tmp[3 + i * 4] = a0 - a1;
  }
  // vertical pass
  for (i = 0; i < 4; ++i, ++w) {
    const int a0 = tmp[0 + i] + tmp[8 + i];
    const int a1 = tmp[4 + i] + tmp[12+ i];
    const int a2 = tmp[4 + i] - tmp[12+ i];
    const int a3 = tmp[0 + i] - tmp[8 + i];
    const int b0 = a0 + a1;
    const int b1 = a3 + a2;
    const int b2 = a3 - a2;
    const int b3 = a0 - a1;

    sum += w[ 0] * abs(b0);
    sum += w[ 4] * abs(b1);
    sum += w[ 8] * abs(b2);
    sum += w[12] * abs(b3);
  }
  return sum;
}